

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_random_ctr_drbg.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__s;
  uchar local_988 [8];
  uchar buf [1024];
  mbedtls_entropy_context entropy;
  mbedtls_ctr_drbg_context ctr_drbg;
  int ret;
  int k;
  int i;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&entropy.source[0x13].strong);
  if (argc < 2) {
    fprintf(_stderr,"usage: %s <output filename>\n",*argv);
    return 1;
  }
  __s = fopen(argv[1],"wb+");
  if (__s == (FILE *)0x0) {
    printf("failed to open \'%s\' for writing.\n",argv[1]);
    return 1;
  }
  mbedtls_entropy_init((mbedtls_entropy_context *)(buf + 0x3f8));
  ctr_drbg.p_entropy._4_4_ =
       mbedtls_ctr_drbg_seed
                 ((mbedtls_ctr_drbg_context *)&entropy.source[0x13].strong,mbedtls_entropy_func,
                  buf + 0x3f8,(uchar *)"RANDOM_GEN",10);
  if (ctr_drbg.p_entropy._4_4_ == 0) {
    mbedtls_ctr_drbg_set_prediction_resistance
              ((mbedtls_ctr_drbg_context *)&entropy.source[0x13].strong,0);
    ctr_drbg.p_entropy._4_4_ =
         mbedtls_ctr_drbg_update_seed_file
                   ((mbedtls_ctr_drbg_context *)&entropy.source[0x13].strong,"seedfile");
    if (ctr_drbg.p_entropy._4_4_ == 0xffffffc6) {
      printf("Failed to open seedfile. Generating one.\n");
      ctr_drbg.p_entropy._4_4_ =
           mbedtls_ctr_drbg_write_seed_file
                     ((mbedtls_ctr_drbg_context *)&entropy.source[0x13].strong,"seedfile");
      if (ctr_drbg.p_entropy._4_4_ != 0) {
        printf("failed in mbedtls_ctr_drbg_write_seed_file: %d\n",(ulong)ctr_drbg.p_entropy._4_4_);
        goto LAB_001024a3;
      }
    }
    else if (ctr_drbg.p_entropy._4_4_ != 0) {
      printf("failed in mbedtls_ctr_drbg_update_seed_file: %d\n",(ulong)ctr_drbg.p_entropy._4_4_);
      goto LAB_001024a3;
    }
    for (ret = 0; ret < 0x300; ret = ret + 1) {
      ctr_drbg.p_entropy._4_4_ =
           mbedtls_ctr_drbg_random(&entropy.source[0x13].strong,local_988,0x400);
      if (ctr_drbg.p_entropy._4_4_ != 0) {
        printf("failed!\n");
        goto LAB_001024a3;
      }
      fwrite(local_988,1,0x400,__s);
      printf("Generating %ldkb of data in file \'%s\'... %04.1f%% done\r",
             (double)(((float)(ret + 1) * 100.0) / 768.0),0x300,argv[1]);
      fflush(_stdout);
    }
    ctr_drbg.p_entropy._4_4_ = 0;
  }
  else {
    printf("failed in mbedtls_ctr_drbg_seed: %d\n",(ulong)ctr_drbg.p_entropy._4_4_);
  }
LAB_001024a3:
  printf("\n");
  fclose(__s);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&entropy.source[0x13].strong);
  mbedtls_entropy_free((mbedtls_entropy_context *)(buf + 0x3f8));
  return ctr_drbg.p_entropy._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int i, k, ret;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_entropy_context entropy;
    unsigned char buf[1024];

    mbedtls_ctr_drbg_init( &ctr_drbg );

    if( argc < 2 )
    {
        mbedtls_fprintf( stderr, "usage: %s <output filename>\n", argv[0] );
        return( 1 );
    }

    if( ( f = fopen( argv[1], "wb+" ) ) == NULL )
    {
        mbedtls_printf( "failed to open '%s' for writing.\n", argv[1] );
        return( 1 );
    }

    mbedtls_entropy_init( &entropy );
    ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy, (const unsigned char *) "RANDOM_GEN", 10 );
    if( ret != 0 )
    {
        mbedtls_printf( "failed in mbedtls_ctr_drbg_seed: %d\n", ret );
        goto cleanup;
    }
    mbedtls_ctr_drbg_set_prediction_resistance( &ctr_drbg, MBEDTLS_CTR_DRBG_PR_OFF );

#if defined(MBEDTLS_FS_IO)
    ret = mbedtls_ctr_drbg_update_seed_file( &ctr_drbg, "seedfile" );

    if( ret == MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR )
    {
        mbedtls_printf( "Failed to open seedfile. Generating one.\n" );
        ret = mbedtls_ctr_drbg_write_seed_file( &ctr_drbg, "seedfile" );
        if( ret != 0 )
        {
            mbedtls_printf( "failed in mbedtls_ctr_drbg_write_seed_file: %d\n", ret );
            goto cleanup;
        }
    }
    else if( ret != 0 )
    {
        mbedtls_printf( "failed in mbedtls_ctr_drbg_update_seed_file: %d\n", ret );
        goto cleanup;
    }
#endif

    for( i = 0, k = 768; i < k; i++ )
    {
        ret = mbedtls_ctr_drbg_random( &ctr_drbg, buf, sizeof( buf ) );
        if( ret != 0 )
        {
            mbedtls_printf("failed!\n");
            goto cleanup;
        }

        fwrite( buf, 1, sizeof( buf ), f );

        mbedtls_printf( "Generating %ldkb of data in file '%s'... %04.1f" \
                "%% done\r", (long)(sizeof(buf) * k / 1024), argv[1], (100 * (float) (i + 1)) / k );
        fflush( stdout );
    }

    ret = 0;

cleanup:
    mbedtls_printf("\n");

    fclose( f );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( ret );
}